

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

int ON_UuidPtr::ComparePtr(ON_UuidPtr *a,ON_UuidPtr *b)

{
  uint uVar1;
  
  if (a == (ON_UuidPtr *)0x0) {
    return -(uint)(b != (ON_UuidPtr *)0x0);
  }
  if (b != (ON_UuidPtr *)0x0) {
    uVar1 = 0xffffffff;
    if (b->m_ptr <= a->m_ptr) {
      uVar1 = (uint)(b->m_ptr < a->m_ptr);
    }
    return uVar1;
  }
  return 1;
}

Assistant:

int ON_UuidPtr::ComparePtr( const ON_UuidPtr* a, const ON_UuidPtr* b )
{
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;
  if (a->m_ptr < b->m_ptr)
    return -1;
  if (a->m_ptr > b->m_ptr)
    return 1;
  return 0;
}